

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  U32 UVar6;
  
  iVar3 = 0x10;
  iVar1 = (int)size / 0x10;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  lVar4 = 0;
  for (iVar5 = 0; iVar5 != iVar1; iVar5 = iVar5 + 1) {
    for (lVar2 = 0; iVar3 + lVar4 != lVar2; lVar2 = lVar2 + 1) {
      UVar6 = table[lVar2] - reducerValue;
      if (table[lVar2] < reducerValue + 2) {
        UVar6 = 0;
      }
      table[lVar2] = UVar6;
    }
    lVar4 = lVar4 + -0x10;
    iVar3 = iVar3 + 0x10;
    table = table + 0x10;
  }
  return;
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}